

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

void presolve::dev_kkt_check::checkBasicFeasibleSolution(State *state,KktConditionDetails *details)

{
  const_reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  long in_RSI;
  int *in_RDI;
  bool holds;
  int i_2;
  int i_1;
  int current_n_cols_basic;
  int current_n_rows_basic;
  int current_n_rows;
  double infeas_1;
  int i;
  double infeas;
  int j;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  int local_24;
  double local_20;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1a),(long)local_14);
    if (*pvVar1 != 0) {
      *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) + 1;
      local_20 = 0.0;
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         (*(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> **)
                           (in_RDI + 0x26),(long)local_14);
      if ((*pvVar2 == kBasic) &&
         (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                              (long)local_14), 1e-07 < ABS(*pvVar3))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Col ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
        poVar4 = std::operator<<(poVar4," is basic but has nonzero dual ");
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                            (long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
        poVar4 = std::operator<<(poVar4,".");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                            (long)local_14);
        local_20 = ABS(*pvVar3);
      }
      if (0.0 < local_20) {
        *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + 1;
        *(double *)(in_RSI + 0x10) = local_20 * local_20 + *(double *)(in_RSI + 0x10);
        if (*(double *)(in_RSI + 8) < local_20) {
          *(double *)(in_RSI + 8) = local_20;
        }
      }
    }
  }
  for (local_24 = 0; local_24 < in_RDI[1]; local_24 = local_24 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1c),(long)local_24);
    if (*pvVar1 != 0) {
      *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) + 1;
      local_30 = 0.0;
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         (*(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> **)
                           (in_RDI + 0x28),(long)local_24);
      if ((*pvVar2 == kBasic) &&
         (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                              (long)local_24), 1e-07 < ABS(*pvVar3))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Row ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
        poVar4 = std::operator<<(poVar4," is basic but has nonzero dual: ");
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                            (long)local_24);
        pvVar5 = (void *)std::ostream::operator<<(poVar4,ABS(*pvVar3));
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                            (long)local_24);
        local_30 = ABS(*pvVar3);
      }
      if (0.0 < local_30) {
        *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + 1;
        *(double *)(in_RSI + 0x10) = local_30 * local_30 + *(double *)(in_RSI + 0x10);
        if (*(double *)(in_RSI + 8) < local_30) {
          *(double *)(in_RSI + 8) = local_30;
        }
      }
    }
  }
  if (*(int *)(in_RSI + 0x1c) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"BFS.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"BFS X Violated: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(in_RSI + 0x1c));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  for (local_40 = 0; local_40 < in_RDI[1]; local_40 = local_40 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1c),(long)local_40);
    if (*pvVar1 != 0) {
      local_34 = local_34 + 1;
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1c),(long)local_40);
    if ((*pvVar1 != 0) &&
       (pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (*(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> **)
                             (in_RDI + 0x28),(long)local_40), *pvVar2 == kBasic)) {
      local_38 = local_38 + 1;
    }
  }
  for (local_44 = 0; local_44 < *in_RDI; local_44 = local_44 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1a),(long)local_44);
    if ((*pvVar1 != 0) &&
       (pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (*(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> **)
                             (in_RDI + 0x26),(long)local_44), *pvVar2 == kBasic)) {
      local_3c = local_3c + 1;
    }
  }
  if (local_3c + local_38 != local_34) {
    *(undefined4 *)(in_RSI + 0x1c) = 0xffffffff;
    poVar4 = std::operator<<((ostream *)&std::cout,"BFS X Violated WRONG basis count: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3c + local_38);
    poVar4 = std::operator<<(poVar4," ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,local_34);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void checkBasicFeasibleSolution(const State& state,
                                KktConditionDetails& details) {
  // Go over cols and check that the duals of basic values are zero.
  assert((int)state.col_status.size() == state.numCol);
  assert((int)state.colDual.size() == state.numCol);
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;
      if (state.col_status[j] == HighsBasisStatus::kBasic &&
          fabs(state.colDual[j]) > tol) {
        if (dev_print == 1)
          std::cout << "Col " << j << " is basic but has nonzero dual "
                    << state.colDual[j] << "." << std::endl;
        infeas = fabs(state.colDual[j]);
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // Go over rows and check that the duals of basic values are zero.
  assert((int)state.row_status.size() == state.numRow);
  assert((int)state.rowDual.size() == state.numRow);
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double infeas = 0;
      if (state.row_status[i] == HighsBasisStatus::kBasic &&
          fabs(state.rowDual[i]) > tol) {
        if (dev_print == 1)
          std::cout << "Row " << i << " is basic but has nonzero dual: "
                    << fabs(state.rowDual[i]) << std::endl;
        infeas = fabs(state.rowDual[i]);
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "BFS." << std::endl;
  } else {
    if (dev_print == 1)
      std::cout << "BFS X Violated: " << details.violated << std::endl;
  }

  // check number of basic rows during postsolve.
  int current_n_rows = 0;
  int current_n_rows_basic = 0;
  int current_n_cols_basic = 0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) current_n_rows++;

    if (state.flagRow[i] && state.row_status[i] == HighsBasisStatus::kBasic)
      current_n_rows_basic++;
  }

  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i] && state.col_status[i] == HighsBasisStatus::kBasic)
      current_n_cols_basic++;
  }

  bool holds = current_n_cols_basic + current_n_rows_basic == current_n_rows;
  if (!holds) {
    details.violated = -1;
    std::cout << "BFS X Violated WRONG basis count: "
              << current_n_cols_basic + current_n_rows_basic << " "
              << current_n_rows << std::endl;
  }
  //  assert(current_n_cols_basic + current_n_rows_basic == current_n_rows);
}